

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O3

void cf_setup_close(Curl_cfilter *cf,Curl_easy *data)

{
  undefined4 *puVar1;
  curl_trc_feat *pcVar2;
  Curl_cfilter *pCVar3;
  
  puVar1 = (undefined4 *)cf->ctx;
  if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
      ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))) &&
     (0 < cf->cft->log_level)) {
    Curl_trc_cf_infof(data,cf,"close");
  }
  cf->field_0x24 = cf->field_0x24 & 0xfe;
  *puVar1 = 0;
  pCVar3 = cf->next;
  if (pCVar3 != (Curl_cfilter *)0x0) {
    (*(code *)pCVar3->cft->do_close)(pCVar3,data);
    Curl_conn_cf_discard_chain(&cf->next,data);
    return;
  }
  return;
}

Assistant:

static void cf_setup_close(struct Curl_cfilter *cf,
                           struct Curl_easy *data)
{
  struct cf_setup_ctx *ctx = cf->ctx;

  CURL_TRC_CF(data, cf, "close");
  cf->connected = FALSE;
  ctx->state = CF_SETUP_INIT;

  if(cf->next) {
    cf->next->cft->do_close(cf->next, data);
    Curl_conn_cf_discard_chain(&cf->next, data);
  }
}